

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O1

void __thiscall
btGeneric6DofConstraint::getInfo2NonVirtual
          (btGeneric6DofConstraint *this,btConstraintInfo2 *info,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  int iVar1;
  
  calculateTransforms(this,transA,transB);
  iVar1 = 0;
  do {
    testAngularLimitMotor(this,iVar1);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 3);
  if (this->m_useOffsetForConstraintFrame == true) {
    iVar1 = setAngularLimits(this,info,0,transA,transB,linVelA,linVelB,angVelA,angVelB);
    setLinearLimits(this,info,iVar1,transA,transB,linVelA,linVelB,angVelA,angVelB);
  }
  else {
    iVar1 = setLinearLimits(this,info,0,transA,transB,linVelA,linVelB,angVelA,angVelB);
    setAngularLimits(this,info,iVar1,transA,transB,linVelA,linVelB,angVelA,angVelB);
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::getInfo2NonVirtual (btConstraintInfo2* info, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	
	btAssert(!m_useSolveConstraintObsolete);
	//prepare constraint
	calculateTransforms(transA,transB);

	int i;
	for (i=0;i<3 ;i++ )
	{
		testAngularLimitMotor(i);
	}

	if(m_useOffsetForConstraintFrame)
	{ // for stability better to solve angular limits first
		int row = setAngularLimits(info, 0,transA,transB,linVelA,linVelB,angVelA,angVelB);
		setLinearLimits(info, row, transA,transB,linVelA,linVelB,angVelA,angVelB);
	}
	else
	{ // leave old version for compatibility
		int row = setLinearLimits(info, 0, transA,transB,linVelA,linVelB,angVelA,angVelB);
		setAngularLimits(info, row,transA,transB,linVelA,linVelB,angVelA,angVelB);
	}
}